

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O0

error<idx2::err_code> idx2::ReadFile(cstr FileName,buffer *Buf)

{
  error<idx2::err_code> eVar1;
  FILE *Buf_00;
  int iVar2;
  allocator *Alloc;
  size_t sVar3;
  error<idx2::err_code> eVar4;
  error<idx2::err_code> eVar5;
  error<idx2::err_code> eVar6;
  error<idx2::err_code> eVar7;
  err_code local_108;
  undefined2 uStack_104;
  anon_class_1_0_00000001 local_f9;
  error<idx2::err_code> local_f8;
  anon_class_8_1_bfec4fc5 local_e8;
  undefined1 local_e0 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:33:3)>
  __ScopeGuard__1;
  anon_class_8_1_ba1cc1b3_for_Func __CleanUpFunc__1;
  err_code local_c0;
  undefined2 uStack_bc;
  anon_class_8_1_bfec4fc5 local_b8;
  error<idx2::err_code> local_b0;
  anon_class_8_1_bfec4fc5 local_a0;
  size_t local_98;
  i64 Size;
  undefined8 local_88;
  anon_class_8_1_bfec4fc5 local_80;
  undefined4 local_74;
  error<idx2::err_code> local_70;
  anon_class_8_1_bfec4fc5 local_50;
  undefined1 local_48 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:17:3)>
  __ScopeGuard__17;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__17;
  FILE *Fp;
  buffer *Buf_local;
  cstr FileName_local;
  err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  Fp = (FILE *)Buf;
  Buf_local = (buffer *)FileName;
  __CleanUpFunc__17.Fp = (FILE **)fopen(FileName,"rb");
  __ScopeGuard__17._8_8_ = &__CleanUpFunc__17;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:17:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:17:3)>
                 *)local_48,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__17.Dismissed);
  if (__CleanUpFunc__17.Fp == (FILE **)0x0) {
    local_50.FileName = (cstr *)&Buf_local;
    eVar4 = ReadFile::anon_class_8_1_bfec4fc5::operator()(&local_50);
    eVar6.Code = local_b0.Code;
    eVar6.StackIdx = local_b0.StackIdx;
    eVar6.StrGened = local_b0.StrGened;
    eVar6._14_2_ = local_b0._14_2_;
    eVar6.Msg = local_b0.Msg;
    eVar5.Code = (err_code)local_88;
    eVar5.StackIdx = local_88._4_1_;
    eVar5.StrGened = (bool)local_88._5_1_;
    eVar5._14_2_ = local_88._6_2_;
    eVar5.Msg = (cstr)Size;
    FileName_local = eVar4.Msg;
    local_70.Code = eVar4.Code;
    local_10 = local_70.Code;
    local_70._12_2_ = eVar4._12_2_;
    uStack_c._0_1_ = local_70.StackIdx;
    uStack_c._1_1_ = local_70.StrGened;
    local_74 = 1;
  }
  else {
    iVar2 = fseeko((FILE *)__CleanUpFunc__17.Fp,0,2);
    if (iVar2 == 0) {
      local_98 = 0;
      local_98 = ftello((FILE *)__CleanUpFunc__17.Fp);
      if (local_98 == 0xffffffffffffffff) {
        local_a0.FileName = (cstr *)&Buf_local;
        eVar6 = ReadFile::anon_class_8_1_bfec4fc5::operator()(&local_a0);
        eVar5.Code = (err_code)local_88;
        eVar5.StackIdx = local_88._4_1_;
        eVar5.StrGened = (bool)local_88._5_1_;
        eVar5._14_2_ = local_88._6_2_;
        eVar5.Msg = (cstr)Size;
        eVar4.Code = local_70.Code;
        eVar4.StackIdx = local_70.StackIdx;
        eVar4.StrGened = local_70.StrGened;
        eVar4._14_2_ = local_70._14_2_;
        eVar4.Msg = local_70.Msg;
        FileName_local = eVar6.Msg;
        local_b0.Code = eVar6.Code;
        local_10 = local_b0.Code;
        local_b0._12_2_ = eVar6._12_2_;
        uStack_c._0_1_ = local_b0.StackIdx;
        uStack_c._1_1_ = local_b0.StrGened;
        local_74 = 1;
      }
      else {
        iVar2 = fseeko((FILE *)__CleanUpFunc__17.Fp,0,0);
        Buf_00 = Fp;
        sVar3 = local_98;
        if (iVar2 == 0) {
          if (*(long *)(Fp + 8) < (long)local_98) {
            Alloc = &Mallocator()->super_allocator;
            AllocBuf((buffer *)Buf_00,sVar3,Alloc);
          }
          __ScopeGuard__1._8_8_ = &Fp;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:33:3)>
          ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:33:3)>
                         *)local_e0,(anon_class_8_1_ba1cc1b3_for_Func *)&__ScopeGuard__1.Dismissed);
          sVar3 = fread(*(void **)Fp,local_98,1,(FILE *)__CleanUpFunc__17.Fp);
          if (sVar3 == 1) {
            __ScopeGuard__1.Func.Buf._0_1_ = 1;
            eVar4 = ReadFile::anon_class_1_0_00000001::operator()(&local_f9);
            eVar7.Code = local_f8.Code;
            eVar7.StackIdx = local_f8.StackIdx;
            eVar7.StrGened = local_f8.StrGened;
            eVar7._14_2_ = local_f8._14_2_;
            eVar7.Msg = local_f8.Msg;
            FileName_local = eVar4.Msg;
            local_108 = eVar4.Code;
            local_10 = local_108;
            uStack_104 = eVar4._12_2_;
            uStack_c = uStack_104;
          }
          else {
            local_e8.FileName = (cstr *)&Buf_local;
            eVar7 = ReadFile::anon_class_8_1_bfec4fc5::operator()(&local_e8);
            FileName_local = eVar7.Msg;
            local_f8.Code = eVar7.Code;
            local_10 = local_f8.Code;
            local_f8._12_2_ = eVar7._12_2_;
            uStack_c._0_1_ = local_f8.StackIdx;
            uStack_c._1_1_ = local_f8.StrGened;
          }
          local_74 = 1;
          local_f8 = eVar7;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:33:3)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:33:3)>
                          *)local_e0);
          eVar6.Code = local_b0.Code;
          eVar6.StackIdx = local_b0.StackIdx;
          eVar6.StrGened = local_b0.StrGened;
          eVar6._14_2_ = local_b0._14_2_;
          eVar6.Msg = local_b0.Msg;
          eVar5.Code = (err_code)local_88;
          eVar5.StackIdx = local_88._4_1_;
          eVar5.StrGened = (bool)local_88._5_1_;
          eVar5._14_2_ = local_88._6_2_;
          eVar5.Msg = (cstr)Size;
          eVar4.Code = local_70.Code;
          eVar4.StackIdx = local_70.StackIdx;
          eVar4.StrGened = local_70.StrGened;
          eVar4._14_2_ = local_70._14_2_;
          eVar4.Msg = local_70.Msg;
        }
        else {
          local_b8.FileName = (cstr *)&Buf_local;
          eVar7 = ReadFile::anon_class_8_1_bfec4fc5::operator()(&local_b8);
          eVar6.Code = local_b0.Code;
          eVar6.StackIdx = local_b0.StackIdx;
          eVar6.StrGened = local_b0.StrGened;
          eVar6._14_2_ = local_b0._14_2_;
          eVar6.Msg = local_b0.Msg;
          eVar5.Code = (err_code)local_88;
          eVar5.StackIdx = local_88._4_1_;
          eVar5.StrGened = (bool)local_88._5_1_;
          eVar5._14_2_ = local_88._6_2_;
          eVar5.Msg = (cstr)Size;
          eVar4.Code = local_70.Code;
          eVar4.StackIdx = local_70.StackIdx;
          eVar4.StrGened = local_70.StrGened;
          eVar4._14_2_ = local_70._14_2_;
          eVar4.Msg = local_70.Msg;
          FileName_local = eVar7.Msg;
          local_c0 = eVar7.Code;
          local_10 = local_c0;
          uStack_bc = eVar7._12_2_;
          uStack_c = uStack_bc;
          local_74 = 1;
        }
      }
    }
    else {
      local_80.FileName = (cstr *)&Buf_local;
      eVar5 = ReadFile::anon_class_8_1_bfec4fc5::operator()(&local_80);
      eVar6.Code = local_b0.Code;
      eVar6.StackIdx = local_b0.StackIdx;
      eVar6.StrGened = local_b0.StrGened;
      eVar6._14_2_ = local_b0._14_2_;
      eVar6.Msg = local_b0.Msg;
      eVar4.Code = local_70.Code;
      eVar4.StackIdx = local_70.StackIdx;
      eVar4.StrGened = local_70.StrGened;
      eVar4._14_2_ = local_70._14_2_;
      eVar4.Msg = local_70.Msg;
      FileName_local = eVar5.Msg;
      local_88._0_4_ = eVar5.Code;
      local_10 = (err_code)local_88;
      local_88._4_2_ = eVar5._12_2_;
      uStack_c = local_88._4_2_;
      local_74 = 1;
    }
  }
  local_88 = eVar5._8_8_;
  Size = (i64)eVar5.Msg;
  local_b0 = eVar6;
  local_70 = eVar4;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:17:3)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:17:3)>
                  *)local_48);
  eVar1.Code = local_10;
  eVar1.Msg = FileName_local;
  eVar1.StackIdx = (undefined1)uStack_c;
  eVar1.StrGened = (bool)uStack_c._1_1_;
  eVar1._14_2_ = uStack_a;
  return eVar1;
}

Assistant:

error<>
ReadFile(cstr FileName, buffer* Buf)
{
  idx2_Assert((Buf->Data && Buf->Bytes) || (!Buf->Data && !Buf->Bytes));

  FILE* Fp = fopen(FileName, "rb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileOpenFailed, "%s", FileName);

  /* Determine the file size */
  if (idx2_FSeek(Fp, 0, SEEK_END))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  i64 Size = 0;
  if ((Size = idx2_FTell(Fp)) == -1)
    return idx2_Error(err_code::FileTellFailed, "%s", FileName);
  if (idx2_FSeek(Fp, 0, SEEK_SET))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  if (Buf->Bytes < Size)
    AllocBuf(Buf, Size);

  /* Read file contents */
  idx2_CleanUp(1, DeallocBuf(Buf));
  if (fread(Buf->Data, size_t(Size), 1, Fp) != 1)
    return idx2_Error(err_code::FileReadFailed, "%s", FileName);

  idx2_DismissCleanUp(1);
  return idx2_Error(err_code::NoError);
}